

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * unpack14_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0x3fff) + base;
  out[1] = (*in >> 0xe & 0x3fff) + base;
  uVar1 = *in;
  out[2] = uVar1 >> 0x1c;
  out[2] = (uVar1 >> 0x1c) + base + (in[1] & 0x3ff) * 0x10;
  out[3] = (in[1] >> 10 & 0x3fff) + base;
  uVar1 = in[1];
  out[4] = uVar1 >> 0x18;
  out[4] = (uVar1 >> 0x18) + base + (in[2] & 0x3f) * 0x100;
  out[5] = (in[2] >> 6 & 0x3fff) + base;
  uVar1 = in[2];
  out[6] = uVar1 >> 0x14;
  out[6] = (uVar1 >> 0x14) + base + (in[3] & 3) * 0x1000;
  out[7] = (in[3] >> 2 & 0x3fff) + base;
  return in + 4;
}

Assistant:

uint32_t * unpack14_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 14 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  14  )   % (1U << 14 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 10 ))<<( 14 - 10 );
    *out += base;
    out++;
    *out = ( (*in) >>  10  )   % (1U << 14 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 6 ))<<( 14 - 6 );
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 14 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 2 ))<<( 14 - 2 );
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 14 )  ;
    *out += base;
    out++;

    return in + 1;
}